

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

xar_file * heap_get_entry(heap_queue_conflict *heap)

{
  ulong uVar1;
  ulong uVar2;
  xar_file *pxVar3;
  int iVar4;
  xar_file *tmp;
  xar_file *r;
  int local_38;
  int c;
  int b;
  int a;
  uint64_t c_id;
  uint64_t b_id;
  uint64_t a_id;
  heap_queue_conflict *heap_local;
  
  if (heap->used < 1) {
    heap_local = (heap_queue_conflict *)0x0;
  }
  else {
    heap_local = (heap_queue_conflict *)*heap->files;
    iVar4 = heap->used + -1;
    heap->used = iVar4;
    *heap->files = heap->files[iVar4];
    c = 0;
    uVar1 = (*heap->files)->id;
    while( true ) {
      local_38 = c * 2 + 1;
      if (heap->used <= local_38) break;
      c_id = heap->files[local_38]->id;
      iVar4 = c * 2 + 2;
      if ((iVar4 < heap->used) && (uVar2 = heap->files[iVar4]->id, uVar2 < c_id)) {
        local_38 = iVar4;
        c_id = uVar2;
      }
      if (uVar1 <= c_id) {
        return (xar_file *)heap_local;
      }
      pxVar3 = heap->files[c];
      heap->files[c] = heap->files[local_38];
      heap->files[local_38] = pxVar3;
      c = local_38;
    }
  }
  return (xar_file *)heap_local;
}

Assistant:

static struct file_info *
heap_get_entry(struct heap_queue *heap)
{
	uint64_t a_key, b_key, c_key;
	int a, b, c;
	struct file_info *r, *tmp;

	if (heap->used < 1)
		return (NULL);

	/*
	 * The first file in the list is the earliest; we'll return this.
	 */
	r = heap->files[0];

	/*
	 * Move the last item in the heap to the root of the tree
	 */
	heap->files[0] = heap->files[--(heap->used)];

	/*
	 * Rebalance the heap.
	 */
	a = 0; /* Starting element and its heap key */
	a_key = heap->files[a]->key;
	for (;;) {
		b = a + a + 1; /* First child */
		if (b >= heap->used)
			return (r);
		b_key = heap->files[b]->key;
		c = b + 1; /* Use second child if it is smaller. */
		if (c < heap->used) {
			c_key = heap->files[c]->key;
			if (c_key < b_key) {
				b = c;
				b_key = c_key;
			}
		}
		if (a_key <= b_key)
			return (r);
		tmp = heap->files[a];
		heap->files[a] = heap->files[b];
		heap->files[b] = tmp;
		a = b;
	}
}